

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap2d_qualities.cpp
# Opt level: O3

Reals __thiscall
Omega_h::swap2d_qualities_tmpl<2>(Omega_h *this,Mesh *mesh,AdaptOpts *opts,LOs *cands2edges)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  Alloc *pAVar4;
  Mesh *this_00;
  Alloc *this_01;
  Alloc *this_02;
  void *extraout_RDX;
  LO size_in;
  size_t sVar5;
  Int ent_dim;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Reals RVar10;
  Write<double> cand_quals_w;
  Reals cand_quals;
  Read<signed_char> edges_are_owned;
  LOs tri_verts2verts;
  LOs edge_verts2verts;
  MetricEdgeLengths<2,_2> length_measure;
  MetricElementQualities<2,_2> quality_measure;
  Read<signed_char> et_codes;
  LOs et2t;
  LOs e2et;
  type f;
  Adj e2t;
  Write<double> local_238;
  LOs local_228;
  Alloc *local_218;
  void *local_210;
  Write<double> local_208;
  Read<signed_char> local_1f8;
  Alloc *local_1e8;
  element_type *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  element_type *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  element_type *local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  Alloc *local_1b0;
  Alloc *local_1a8;
  Mesh *local_1a0;
  MetricEdgeLengths<2,_2> local_198;
  MetricElementQualities<2,_2> local_178;
  Alloc *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Alloc *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  Alloc *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_128 [32];
  Alloc *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  Alloc *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  Alloc *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  Alloc *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  Alloc *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  Alloc *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  Alloc *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,1,2);
  local_138 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  this_02 = local_138;
  local_130._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_148 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_140._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_158 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  this_01 = local_158;
  local_150._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  ent_dim = (Int)mesh;
  local_1a8 = local_148;
  local_1a0 = (Mesh *)this;
  Mesh::ask_verts_of((Mesh *)&local_1c8,ent_dim);
  Mesh::ask_verts_of((Mesh *)&local_1d8,ent_dim);
  Mesh::owned((Mesh *)&local_1e8,ent_dim);
  MetricElementQualities<2,_2>::MetricElementQualities(&local_178,mesh);
  local_1b0 = (Alloc *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  MetricEdgeLengths<2,_2>::MetricEdgeLengths(&local_198,mesh);
  pAVar3 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar5 = pAVar3->size;
  }
  else {
    sVar5 = (ulong)pAVar3 >> 3;
  }
  local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)opts->max_length_allowed;
  local_128._0_8_ = (element_type *)(local_128 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  size_in = (LO)(sVar5 >> 2);
  Write<double>::Write(&local_238,size_in,(string *)local_128);
  if ((element_type *)local_128._0_8_ != (element_type *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  this_00 = local_1a0;
  pAVar3 = local_1a8;
  local_128._0_8_ = (cands2edges->write_).shared_alloc_.alloc;
  if ((local_128._0_8_ & 7) == 0 && (Alloc *)local_128._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128._0_8_ = ((Alloc *)local_128._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_128._0_8_)->use_count = ((Alloc *)local_128._0_8_)->use_count + 1;
    }
  }
  local_128._8_8_ = (cands2edges->write_).shared_alloc_.direct_ptr;
  local_128._16_8_ = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128._16_8_ = local_1e8->size * 8 + 1;
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  local_128._24_8_ = local_1e0;
  local_108 = local_238.shared_alloc_.alloc;
  if (((ulong)local_238.shared_alloc_.alloc & 7) == 0 &&
      local_238.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)((local_238.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_238.shared_alloc_.alloc)->use_count = (local_238.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.shared_alloc_.direct_ptr;
  local_f8 = this_02;
  bVar6 = ((ulong)this_02 & 7) == 0;
  if (bVar6 && this_02 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(this_02->size * 8 + 1);
    }
    else {
      this_02->use_count = this_02->use_count + 1;
    }
  }
  local_f0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  bVar7 = ((ulong)this_01 & 7) == 0;
  local_e8 = this_01;
  if (bVar7 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  local_d8 = local_1a8;
  bVar8 = local_1a8 != (Alloc *)0x0;
  bVar9 = ((ulong)local_1a8 & 7) == 0;
  if (bVar9 && bVar8) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0;
  local_c8 = (Alloc *)local_1d8._M_pi;
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)((long)(local_1d8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1d8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
  local_b8 = local_198.coords.write_.shared_alloc_.alloc;
  if (((ulong)local_198.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((local_198.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_198.coords.write_.shared_alloc_.alloc)->use_count =
           (local_198.coords.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_198.coords.write_.shared_alloc_.direct_ptr;
  local_a8 = local_198.metrics.write_.shared_alloc_.alloc;
  if (((ulong)local_198.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)((local_198.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_198.metrics.write_.shared_alloc_.alloc)->use_count =
           (local_198.metrics.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_198.metrics.write_.shared_alloc_.direct_ptr;
  local_98 = (element_type *)local_1b8._M_pi;
  local_90._M_pi = local_1c8._M_pi;
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_1c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_88 = local_1c0;
  local_80._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178.coords.write_.shared_alloc_.alloc;
  if (((ulong)local_178.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_178.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_178.coords.write_.shared_alloc_.alloc)->use_count =
           (local_178.coords.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78 = (element_type *)local_178.coords.write_.shared_alloc_.direct_ptr;
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178.metrics.write_.shared_alloc_.alloc;
  if (((ulong)local_178.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_178.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_178.metrics.write_.shared_alloc_.alloc)->use_count =
           (local_178.metrics.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68 = (element_type *)local_178.metrics.write_.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,(type *)local_128,"swap2d_qualities");
  local_208.shared_alloc_.alloc = local_238.shared_alloc_.alloc;
  if (((ulong)local_238.shared_alloc_.alloc & 7) == 0 &&
      local_238.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208.shared_alloc_.alloc = (Alloc *)((local_238.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_238.shared_alloc_.alloc)->use_count = (local_238.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_208.shared_alloc_.direct_ptr = local_238.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_1f8,&local_208);
  pAVar4 = local_208.shared_alloc_.alloc;
  if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
      local_208.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_208.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_208.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_228.write_.shared_alloc_.alloc = local_1f8.write_.shared_alloc_.alloc;
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228.write_.shared_alloc_.alloc =
           (Alloc *)((local_1f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f8.write_.shared_alloc_.alloc)->use_count =
           (local_1f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_228.write_.shared_alloc_.direct_ptr = local_1f8.write_.shared_alloc_.direct_ptr;
  local_218 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218 = (Alloc *)(local_218->size * 8 + 1);
    }
    else {
      local_218->use_count = local_218->use_count + 1;
    }
  }
  local_210 = (cands2edges->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            (this_00,ent_dim,(Read<double> *)0x1,&local_228,-1.0,(Int)&local_218);
  pAVar4 = local_218;
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    piVar1 = &local_218->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_228.write_.shared_alloc_.alloc;
  if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
      local_228.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_228.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
      operator_delete(local_1f8.write_.shared_alloc_.alloc,0x48);
    }
  }
  swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::
  {lambda(int)#1}::~AdaptOpts((_lambda_int__1_ *)local_128);
  if (((ulong)local_238.shared_alloc_.alloc & 7) == 0 &&
      local_238.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_238.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238.shared_alloc_.alloc);
      operator_delete(local_238.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_198.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.metrics.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.metrics.write_.shared_alloc_.alloc);
      operator_delete(local_198.metrics.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_198.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.coords.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.coords.write_.shared_alloc_.alloc);
      operator_delete(local_198.coords.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_178.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.metrics.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.metrics.write_.shared_alloc_.alloc);
      operator_delete(local_178.metrics.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_178.coords.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.coords.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.coords.write_.shared_alloc_.alloc);
      operator_delete(local_178.coords.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    piVar1 = &local_1e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8);
      operator_delete(local_1e8,0x48);
    }
  }
  if (((ulong)local_1d8._M_pi & 7) == 0 && (Alloc *)local_1d8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_1d8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_1d8._M_pi);
      operator_delete(local_1d8._M_pi,0x48);
    }
  }
  if (((ulong)local_1c8._M_pi & 7) == 0 && (Alloc *)local_1c8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_1c8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_1c8._M_pi);
      operator_delete(local_1c8._M_pi,0x48);
    }
  }
  if (bVar7 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
    }
  }
  if (bVar9 && bVar8) {
    piVar1 = &pAVar3->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  if (bVar6 && this_02 != (Alloc *)0x0) {
    piVar1 = &this_02->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_02);
      operator_delete(this_02,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this_00;
  return (Reals)RVar10.write_.shared_alloc_;
}

Assistant:

Reals swap2d_qualities_tmpl(
    Mesh* mesh, AdaptOpts const& opts, LOs cands2edges) {
  auto e2t = mesh->ask_up(EDGE, FACE);
  auto e2et = e2t.a2ab;
  auto et2t = e2t.ab2b;
  auto et_codes = e2t.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tri_verts2verts = mesh->ask_verts_of(FACE);
  auto edges_are_owned = mesh->owned(EDGE);
  auto quality_measure = MetricElementQualities<2, metric_dim>(mesh);
  auto length_measure = MetricEdgeLengths<2, metric_dim>(mesh);
  auto max_length = opts.max_length_allowed;
  auto ncands = cands2edges.size();
  auto cand_quals_w = Write<Real>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto edge = cands2edges[cand];
    /* non-owned edges will have incomplete cavities
       and will run into the topological assertions
       in find_loop(). don't bother; their results
       will be overwritten by the owner's anyways */
    if (!edges_are_owned[edge]) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    OMEGA_H_CHECK(e2et[edge + 1] == 2 + e2et[edge]);
    LO t[2];
    Few<LO, 2> ov;
    for (Int i = 0; i < 2; ++i) {
      auto et = e2et[edge] + i;
      auto code = et_codes[et];
      auto tte = code_which_down(code);
      auto rot = code_rotation(code);
      t[rot] = et2t[et];
      auto ttv = simplex_opposite_template(FACE, EDGE, tte);
      ov[rot] = tri_verts2verts[t[rot] * 3 + ttv];
    }
    auto l = length_measure.measure(ov);
    if (l > max_length) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    auto ev = gather_verts<2>(edge_verts2verts, edge);
    Real minqual = 1.0;
    for (Int i = 0; i < 2; ++i) {
      Few<LO, 3> ntv;
      ntv[0] = ev[1 - i];
      ntv[1] = ov[i];
      ntv[2] = ov[1 - i];
      auto qual = quality_measure.measure(ntv);
      minqual = min2(minqual, qual);
    }
    cand_quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "swap2d_qualities");
  auto cand_quals = Reals(cand_quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, cands2edges, -1.0, 1);
}